

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

void __thiscall
cs222::Instruction::Instruction
          (Instruction *this,size_t *lineNumber,string *line,string *label,string *operation,
          Operand *firstOperand,Operand *secondOperand,string *operandsToken,string *comment,
          bitset<6UL> *flags)

{
  pointer pcVar1;
  
  this->lineNumber = *lineNumber;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->line,pcVar1,pcVar1 + line->_M_string_length);
  this->commentLine = false;
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  pcVar1 = (label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label,pcVar1,pcVar1 + label->_M_string_length);
  (this->operation)._M_dataplus._M_p = (pointer)&(this->operation).field_2;
  pcVar1 = (operation->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->operation,pcVar1,pcVar1 + operation->_M_string_length);
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
            (&this->operands,firstOperand,secondOperand);
  (this->operandsToken)._M_dataplus._M_p = (pointer)&(this->operandsToken).field_2;
  pcVar1 = (operandsToken->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->operandsToken,pcVar1,pcVar1 + operandsToken->_M_string_length);
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  pcVar1 = (comment->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->comment,pcVar1,pcVar1 + comment->_M_string_length);
  (this->flags).super__Base_bitset<1UL>._M_w = (flags->super__Base_bitset<1UL>)._M_w;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Instruction::Instruction(
            const size_t& lineNumber,
            const std::string& line,
            const std::string& label,
            const std::string& operation,
            const Operand& firstOperand,
            const Operand& secondOperand,
            const std::string& operandsToken,
            const std::string& comment,
            const std::bitset<6>& flags) :
        lineNumber(lineNumber), line(line), commentLine(false),
        label(label), operation(operation),
        operands(Operand_pair(firstOperand, secondOperand)),
        operandsToken(operandsToken), comment(comment), flags(flags) { }